

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,GLenum value)

{
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  GLenum value_local;
  string *result;
  
  local_14 = (int)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_16);
  std::allocator<char>::~allocator(&local_16);
  if (local_14 == 0x82ee) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GL_VERTICES_SUBMITTED_ARB");
  }
  else if (local_14 == 0x82ef) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GL_PRIMITIVES_SUBMITTED_ARB");
  }
  else if (local_14 == 0x82f0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_VERTEX_SHADER_INVOCATIONS_ARB");
  }
  else if (local_14 == 0x82f1) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_TESS_CONTROL_SHADER_PATCHES_ARB");
  }
  else if (local_14 == 0x82f2) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB");
  }
  else if (local_14 == 0x82f3) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB");
  }
  else if (local_14 == 0x82f4) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_FRAGMENT_SHADER_INVOCATIONS_ARB");
  }
  else if (local_14 == 0x82f5) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_COMPUTE_SHADER_INVOCATIONS_ARB");
  }
  else if (local_14 == 0x82f6) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_CLIPPING_INPUT_PRIMITIVES_ARB");
  }
  else if (local_14 == 0x82f7) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_CLIPPING_OUTPUT_PRIMITIVES_ARB");
  }
  else if (local_14 == 0x887f) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"GL_GEOMETRY_SHADER_INVOCATIONS");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getStringForEnum(glw::GLenum value)
{
	std::string result = "[?]";

	switch (value)
	{
	case GL_CLIPPING_INPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_INPUT_PRIMITIVES_ARB";
		break;
	case GL_CLIPPING_OUTPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_OUTPUT_PRIMITIVES_ARB";
		break;
	case GL_COMPUTE_SHADER_INVOCATIONS_ARB:
		result = "GL_COMPUTE_SHADER_INVOCATIONS_ARB";
		break;
	case GL_FRAGMENT_SHADER_INVOCATIONS_ARB:
		result = "GL_FRAGMENT_SHADER_INVOCATIONS_ARB";
		break;
	case GL_GEOMETRY_SHADER_INVOCATIONS:
		result = "GL_GEOMETRY_SHADER_INVOCATIONS";
		break;
	case GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB:
		result = "GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB";
		break;
	case GL_PRIMITIVES_SUBMITTED_ARB:
		result = "GL_PRIMITIVES_SUBMITTED_ARB";
		break;
	case GL_TESS_CONTROL_SHADER_PATCHES_ARB:
		result = "GL_TESS_CONTROL_SHADER_PATCHES_ARB";
		break;
	case GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB:
		result = "GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTEX_SHADER_INVOCATIONS_ARB:
		result = "GL_VERTEX_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTICES_SUBMITTED_ARB:
		result = "GL_VERTICES_SUBMITTED_ARB";
		break;
	} /* switch (value) */

	return result;
}